

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O2

void EntityRelationTask::er_allow_skip_decoding
               (search *sch,multi_ex *ec,v_array<unsigned_long> *predictions)

{
  void *pvVar1;
  example *ex;
  v_array<unsigned_long> *pvVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  pointer ppeVar6;
  size_t sVar7;
  uint uVar8;
  pointer ppeVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  double dVar15;
  undefined1 auVar16 [16];
  
  pvVar1 = sch->task_data;
  lVar4 = (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish +
          (1 - (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start);
  auVar16._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar16._0_8_ = lVar4;
  auVar16._12_4_ = 0x45300000;
  dVar15 = SQRT((auVar16._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) + -1.0;
  uVar5 = (ulong)dVar15;
  *(undefined1 *)((long)pvVar1 + 0x11) = 1;
  ppeVar6 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar9 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar11 = 0;
  uVar12 = 0;
  uVar8 = 0;
  bVar3 = false;
  while (uVar10 = (long)ppeVar9 - (long)ppeVar6 >> 3,
        pvVar2 = (v_array<unsigned_long> *)((ulong)uVar8 % (uVar10 & 0xffffffff)), uVar11 != uVar10)
  {
    if (predictions->_begin[(long)pvVar2] == 0) {
      if (bVar3) {
        *(undefined1 *)((long)pvVar1 + 0x11) = 0;
      }
      ex = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
           super__Vector_impl_data._M_start[(long)pvVar2];
      if (pvVar2 < (v_array<unsigned_long> *)
                   (((long)(dVar15 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5) >> 1)) {
        sVar7 = predict_entity(sch,ex,pvVar2,(ptag)pvVar2,false);
      }
      else {
        sVar7 = predict_relation(sch,ex,predictions,(ptag)pvVar2,false);
      }
      if ((int)sVar7 != 0xb) {
        predictions->_begin[(long)pvVar2] = sVar7;
        uVar11 = uVar11 + 1;
      }
      if (bVar3) {
        *(undefined1 *)((long)pvVar1 + 0x11) = 1;
      }
      bVar3 = false;
    }
    ppeVar6 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppeVar9 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    bVar13 = uVar11 == uVar12;
    bVar14 = (v_array<unsigned_long> *)(((long)ppeVar9 - (long)ppeVar6 >> 3) + -1) == pvVar2;
    if (bVar14) {
      uVar12 = uVar11;
    }
    bVar3 = (bool)(bVar3 | (bVar14 && bVar13));
    uVar8 = uVar8 + 1;
  }
  return;
}

Assistant:

void er_allow_skip_decoding(Search::search& sch, multi_ex& ec, v_array<size_t>& predictions)
{
  task_data* my_task_data = sch.get_task_data<task_data>();
  // ec.size = #entity + #entity*(#entity-1)/2
  size_t n_ent = (size_t)(sqrt(ec.size() * 8 + 1) - 1) / 2;

  bool must_predict = false;
  size_t n_predicts = 0;
  size_t p_n_predicts = 0;
  my_task_data->allow_skip = true;

  // loop until all the entity and relation types are predicted
  for (ptag t = 0;; t++)
  {
    ptag i = t % (uint32_t)ec.size();
    if (n_predicts == ec.size())
      break;

    if (predictions[i] == 0)
    {
      if (must_predict)
      {
        my_task_data->allow_skip = false;
      }
      size_t prediction = 0;
      if (i < n_ent)  // do entity recognition
      {
        prediction = predict_entity(sch, ec[i], predictions, i);
      }
      else  // do relation recognition
      {
        prediction = predict_relation(sch, ec[i], predictions, i);
      }

      if (prediction != LABEL_SKIP)
      {
        predictions[i] = prediction;
        n_predicts++;
      }

      if (must_predict)
      {
        my_task_data->allow_skip = true;
        must_predict = false;
      }
    }

    if (i == ec.size() - 1)
    {
      if (n_predicts == p_n_predicts)
      {
        must_predict = true;
      }
      p_n_predicts = n_predicts;
    }
  }
}